

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::compute::anon_unknown_0::ImageAtomicOpTestInstance::iterate
          (TestStatus *__return_storage_ptr__,ImageAtomicOpTestInstance *this)

{
  VkDeviceSize bufferSize;
  uint uVar1;
  void *pvVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this_00;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  Handle<(vk::HandleType)24> obj;
  Allocation *pAVar3;
  int i;
  deUint32 dVar4;
  DeviceInterface *pDVar5;
  VkDevice pVVar6;
  Allocator *allocator;
  long lVar7;
  DescriptorSetLayoutBuilder *pDVar8;
  DescriptorPoolBuilder *pDVar9;
  DescriptorSetUpdateBuilder *pDVar10;
  const_iterator cVar11;
  uint uVar12;
  int accum;
  int iVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  VkDeviceSize bufferSize_00;
  VkExtent3D extent;
  Move<vk::Handle<(vk::HandleType)24>_> local_588;
  VkDevice local_568;
  deUint32 local_55c;
  VkImageMemoryBarrier imagePreCopyBarrier;
  long local_4f8;
  long *plStack_4f0;
  pointer local_4e8;
  VkAllocationCallbacks *pVStack_4e0;
  VkQueue local_4d8;
  DeviceInterface *local_4d0;
  VkPipelineLayout local_4c8;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_4c0;
  VkDescriptorSetLayout local_4a8;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_4a0;
  Buffer inputBuffer;
  Image image;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_3d0;
  VkPipeline local_3b8;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_3b0;
  VkShaderModule local_398;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_390;
  VkDescriptorPool local_378;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_370;
  VkImageView local_358;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_350;
  Buffer outputBuffer;
  VkDescriptorBufferInfo bufferDescriptorInfo;
  VkDescriptorImageInfo imageDescriptorInfo;
  Random rnd;
  pointer local_2c8;
  VkDescriptorPool VStack_2c0;
  VkImage local_2b0;
  pointer local_2a8;
  pointer local_298;
  ios_base local_268 [272];
  Move<vk::VkCommandBuffer_s_*> local_158;
  VkBufferImageCopy copyParams;
  VkBufferMemoryBarrier outputBufferPostCopyBarrier;
  VkBufferMemoryBarrier inputBufferPostHostWriteBarrier;
  VkImageCreateInfo imageParams;
  
  pDVar5 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar6 = Context::getDevice((this->super_TestInstance).m_context);
  local_4d8 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  local_55c = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  imageParams.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_2D;
  imageParams.format = VK_FORMAT_R32_UINT;
  imageParams.extent._0_8_ = *(undefined8 *)(this->m_imageSize).m_data;
  imageParams.extent.depth = 1;
  imageParams.mipLevels = 1;
  imageParams.arrayLayers = 1;
  imageParams.samples = VK_SAMPLE_COUNT_1_BIT;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 9;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams.queueFamilyIndexCount = 0;
  imageParams.pQueueFamilyIndices = (deUint32 *)0x0;
  imageParams.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  Image::Image(&image,pDVar5,pVVar6,allocator,&imageParams,(MemoryRequirement)0x0);
  iVar13 = 1;
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = 1;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&rnd,pDVar5,pVVar6,
                (VkImage)image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                         m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R32_UINT,subresourceRange);
  DStack_350.m_device = (VkDevice)local_2c8;
  DStack_350.m_allocator = (VkAllocationCallbacks *)VStack_2c0.m_internal;
  local_358.m_internal._0_4_ = rnd.m_rnd.x;
  local_358.m_internal._4_4_ = rnd.m_rnd.y;
  DStack_350.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  lVar7 = 0;
  do {
    iVar13 = iVar13 * (this->m_imageSize).m_data[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 == 1);
  uVar14 = iVar13 * this->m_localSize;
  bufferSize = (ulong)uVar14 * 4;
  makeBufferCreateInfo((VkBufferCreateInfo *)&rnd,bufferSize,0x20);
  compute::Buffer::Buffer
            (&inputBuffer,pDVar5,pVVar6,allocator,(VkBufferCreateInfo *)&rnd,(MemoryRequirement)0x1)
  ;
  local_568 = pVVar6;
  local_4d0 = pDVar5;
  deRandom_init(&rnd.m_rnd,0x77238ac2);
  pAVar3 = inputBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  if (uVar14 != 0) {
    pvVar2 = (inputBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr;
    lVar7 = 0;
    do {
      dVar4 = deRandom_getUint32(&rnd.m_rnd);
      *(deUint32 *)((long)pvVar2 + lVar7 * 4) = dVar4;
      lVar7 = lVar7 + 1;
    } while (uVar14 != (uint)lVar7);
  }
  pDVar5 = local_4d0;
  pVVar6 = local_568;
  ::vk::flushMappedMemoryRange
            (local_4d0,local_568,(VkDeviceMemory)(pAVar3->m_memory).m_internal,pAVar3->m_offset,
             bufferSize);
  uVar14 = 1;
  lVar7 = 0;
  do {
    uVar14 = uVar14 * (this->m_imageSize).m_data[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 == 1);
  bufferSize_00 = (ulong)uVar14 << 2;
  makeBufferCreateInfo((VkBufferCreateInfo *)&rnd,bufferSize_00,2);
  compute::Buffer::Buffer
            (&outputBuffer,pDVar5,pVVar6,allocator,(VkBufferCreateInfo *)&rnd,(MemoryRequirement)0x1
            );
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder((DescriptorSetLayoutBuilder *)&rnd);
  pDVar8 = ::vk::DescriptorSetLayoutBuilder::addBinding
                     ((DescriptorSetLayoutBuilder *)&rnd,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,
                      (VkSampler *)0x0);
  pDVar8 = ::vk::DescriptorSetLayoutBuilder::addBinding
                     (pDVar8,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1,0x20,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&imagePreCopyBarrier,pDVar8,pDVar5,pVVar6,0);
  DStack_4a0.m_device = (VkDevice)imagePreCopyBarrier._16_8_;
  DStack_4a0.m_allocator = (VkAllocationCallbacks *)imagePreCopyBarrier._24_8_;
  local_4a8.m_internal = imagePreCopyBarrier._0_8_;
  DStack_4a0.m_deviceIface = (DeviceInterface *)imagePreCopyBarrier.pNext;
  imagePreCopyBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imagePreCopyBarrier._4_4_ = 0;
  imagePreCopyBarrier.pNext = (void *)0x0;
  imagePreCopyBarrier.srcAccessMask = 0;
  imagePreCopyBarrier.dstAccessMask = 0;
  imagePreCopyBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  imagePreCopyBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  if (local_2a8 != (pointer)0x0) {
    operator_delete(local_2a8,(long)local_298 - (long)local_2a8);
  }
  if ((VkAllocationCallbacks *)VStack_2c0.m_internal != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)VStack_2c0.m_internal,local_2b0.m_internal - VStack_2c0.m_internal);
  }
  if (rnd.m_rnd._0_8_ != 0) {
    operator_delete((void *)rnd.m_rnd._0_8_,(long)local_2c8 - rnd.m_rnd._0_8_);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&imagePreCopyBarrier);
  pDVar9 = ::vk::DescriptorPoolBuilder::addType
                     ((DescriptorPoolBuilder *)&imagePreCopyBarrier,
                      VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pDVar9 = ::vk::DescriptorPoolBuilder::addType(pDVar9,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&rnd,pDVar9,pDVar5,pVVar6,1,1);
  DStack_370.m_device = (VkDevice)local_2c8;
  DStack_370.m_allocator = (VkAllocationCallbacks *)VStack_2c0.m_internal;
  local_378.m_internal._0_4_ = rnd.m_rnd.x;
  local_378.m_internal._4_4_ = rnd.m_rnd.y;
  DStack_370.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  local_2c8 = (pointer)0x0;
  VStack_2c0.m_internal = 0;
  if (imagePreCopyBarrier._0_8_ != 0) {
    operator_delete((void *)imagePreCopyBarrier._0_8_,
                    imagePreCopyBarrier._16_8_ - imagePreCopyBarrier._0_8_);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&rnd,pDVar5,pVVar6,local_378,local_4a8)
  ;
  local_4e8 = local_2c8;
  pVStack_4e0 = (VkAllocationCallbacks *)VStack_2c0.m_internal;
  local_4f8._0_4_ = rnd.m_rnd.x;
  local_4f8._4_4_ = rnd.m_rnd.y;
  plStack_4f0 = (long *)rnd.m_rnd._8_8_;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder((DescriptorSetUpdateBuilder *)&rnd);
  pDVar10 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&rnd,(int)local_4f8,(void *)0x0,0);
  pDVar10 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write(pDVar10,(int)local_4f8,&DAT_00000001,0);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar10,pDVar5,pVVar6);
  if (local_2a8 != (pointer)0x0) {
    operator_delete(local_2a8,(long)local_298 - (long)local_2a8);
  }
  if ((VkAllocationCallbacks *)VStack_2c0.m_internal != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)VStack_2c0.m_internal,local_2b0.m_internal - VStack_2c0.m_internal);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&rnd);
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             *)((this->super_TestInstance).m_context)->m_progCollection;
  imagePreCopyBarrier._0_8_ = &imagePreCopyBarrier.srcAccessMask;
  std::__cxx11::string::_M_construct<char_const*>((string *)&imagePreCopyBarrier,"comp","");
  cVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(this_00,(key_type *)&imagePreCopyBarrier);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&rnd,pDVar5,pVVar6,
             *(ProgramBinary **)(cVar11._M_node + 2),0);
  DStack_390.m_device = (VkDevice)local_2c8;
  DStack_390.m_allocator = (VkAllocationCallbacks *)VStack_2c0.m_internal;
  local_398.m_internal._0_4_ = rnd.m_rnd.x;
  local_398.m_internal._4_4_ = rnd.m_rnd.y;
  DStack_390.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  local_2c8 = (pointer)0x0;
  VStack_2c0.m_internal = 0;
  if ((VkAccessFlags *)imagePreCopyBarrier._0_8_ != &imagePreCopyBarrier.srcAccessMask) {
    operator_delete((void *)imagePreCopyBarrier._0_8_,imagePreCopyBarrier._16_8_ + 1);
  }
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&rnd,pDVar5,pVVar6,local_4a8);
  DStack_4c0.m_device = (VkDevice)local_2c8;
  DStack_4c0.m_allocator = (VkAllocationCallbacks *)VStack_2c0.m_internal;
  local_4c8.m_internal._0_4_ = rnd.m_rnd.x;
  local_4c8.m_internal._4_4_ = rnd.m_rnd.y;
  DStack_4c0.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&rnd,pDVar5,pVVar6,
                      (VkPipelineLayout)rnd.m_rnd._0_8_,local_398);
  DStack_3b0.m_device = (VkDevice)local_2c8;
  DStack_3b0.m_allocator = (VkAllocationCallbacks *)VStack_2c0.m_internal;
  local_3b8.m_internal._0_4_ = rnd.m_rnd.x;
  local_3b8.m_internal._4_4_ = rnd.m_rnd.y;
  DStack_3b0.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  makeBufferMemoryBarrier
            (&inputBufferPostHostWriteBarrier,0x4000,0x20,
             (VkBuffer)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.layerCount = 1;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)&rnd,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_GENERAL,
             (VkImage)image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,subresourceRange_00);
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.layerCount = 1;
  makeImageMemoryBarrier
            (&imagePreCopyBarrier,0x40,0x800,VK_IMAGE_LAYOUT_GENERAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             (VkImage)image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,subresourceRange_01);
  dVar4 = 0;
  makeBufferMemoryBarrier
            (&outputBufferPostCopyBarrier,0x1000,0x2000,
             (VkBuffer)
             outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize_00);
  extent.depth = 1;
  extent.width = 1;
  extent.height = 0;
  makeBufferImageCopy(&copyParams,*(compute **)(this->m_imageSize).m_data,extent,dVar4);
  makeCommandPool(&local_588,pDVar5,pVVar6,local_55c);
  obj.m_internal = local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal
  ;
  DStack_3d0.m_device =
       local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  DStack_3d0.m_allocator =
       local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  DStack_3d0.m_deviceIface =
       local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  ::vk::allocateCommandBuffer
            (&local_158,pDVar5,pVVar6,
             (VkCommandPool)
             local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       local_158.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device;
  local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       local_158.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal;
  local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       (deUint64)local_158.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       local_158.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface;
  beginCommandBuffer(pDVar5,local_158.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  (*pDVar5->_vptr_DeviceInterface[0x4c])
            (pDVar5,local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                    m_internal,1,local_3b8.m_internal);
  (*pDVar5->_vptr_DeviceInterface[0x56])
            (pDVar5,local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                    m_internal,1,local_4c8.m_internal,0,1,&local_4f8,0,0);
  (*pDVar5->_vptr_DeviceInterface[0x6d])
            (pDVar5,local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                    m_internal,0x4000,0x800,0,0,0,1,&inputBufferPostHostWriteBarrier,1,
             (int)(VkImageMemoryBarrier *)&rnd);
  (*pDVar5->_vptr_DeviceInterface[0x5d])
            (pDVar5,local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                    m_internal,(ulong)(uint)(this->m_imageSize).m_data[0],
             (ulong)(uint)(this->m_imageSize).m_data[1],1);
  (*pDVar5->_vptr_DeviceInterface[0x6d])
            (pDVar5,local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                    m_internal,0x800,0x1000,0,0,0,0,0,1,(int)&imagePreCopyBarrier);
  (*pDVar5->_vptr_DeviceInterface[99])
            (pDVar5,local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                    m_internal,
             image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,6,
             outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,1,(int)&copyParams);
  (*pDVar5->_vptr_DeviceInterface[0x6d])
            (pDVar5,local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                    m_internal,0x1000,0x4000,0,0,0,1,&outputBufferPostCopyBarrier,0,0);
  endCommandBuffer(pDVar5,(VkCommandBuffer)
                          local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                          m_internal);
  submitCommandsAndWait
            (pDVar5,local_568,local_4d8,
             (VkCommandBuffer)
             local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
  if ((VkCommandBuffer)
      local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal !=
      (VkCommandBuffer)0x0) {
    local_158.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
         (VkCommandBuffer_s *)
         local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    (*(local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface
               ,local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device,
               local_588.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,1
              );
  }
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&DStack_3d0,(VkCommandPool)obj.m_internal);
  }
  if (local_3b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_3b0,local_3b8);
  }
  pVVar6 = local_568;
  if (local_4c8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_4c0,local_4c8);
  }
  if (local_398.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_390,local_398);
  }
  pAVar3 = outputBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (pDVar5,pVVar6,
             (VkDeviceMemory)
             ((outputBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (outputBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize_00);
  if (uVar14 != 0) {
    uVar1 = this->m_localSize;
    uVar15 = 0;
    uVar12 = 0;
    do {
      iVar13 = 0;
      if ((ulong)uVar1 != 0) {
        iVar13 = 0;
        uVar16 = (ulong)uVar1;
        uVar17 = uVar15;
        do {
          iVar13 = iVar13 + *(int *)((long)(inputBuffer.m_allocation.
                                            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                            .m_data.ptr)->m_hostPtr + (ulong)uVar17 * 4);
          uVar17 = uVar17 + 1;
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
      }
      if (*(int *)((long)pAVar3->m_hostPtr + (ulong)uVar12 * 4) != iVar13) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&rnd);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&rnd,"Comparison failed for pixel ",0x1c);
        std::ostream::_M_insert<unsigned_long>((ulong)&rnd);
        std::__cxx11::stringbuf::str();
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,imagePreCopyBarrier._0_8_,
                   (long)imagePreCopyBarrier.pNext + imagePreCopyBarrier._0_8_);
        if ((VkAccessFlags *)imagePreCopyBarrier._0_8_ != &imagePreCopyBarrier.srcAccessMask) {
          operator_delete((void *)imagePreCopyBarrier._0_8_,imagePreCopyBarrier._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&rnd);
        std::ios_base::~ios_base(local_268);
        goto LAB_0070c427;
      }
      uVar12 = uVar12 + 1;
      uVar15 = uVar15 + uVar1;
    } while (uVar12 != uVar14);
  }
  rnd.m_rnd._0_8_ = &local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rnd,"Compute succeeded","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,rnd.m_rnd._0_8_,
             rnd.m_rnd._8_8_ + rnd.m_rnd._0_8_);
  if ((pointer *)rnd.m_rnd._0_8_ != &local_2c8) {
    operator_delete((void *)rnd.m_rnd._0_8_,
                    (ulong)((long)&(local_2c8->imageInfos).
                                   super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
LAB_0070c427:
  if (local_4f8 != 0) {
    rnd.m_rnd.x = (undefined4)local_4f8;
    rnd.m_rnd.y = local_4f8._4_4_;
    (**(code **)(*plStack_4f0 + 0x1e8))(plStack_4f0,local_4e8,pVStack_4e0,1);
  }
  if (local_378.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_370,local_378);
  }
  if (local_4a8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_4a0,local_4a8);
  }
  if (outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (outputBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(outputBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    outputBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal !=
      0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (inputBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
      .m_data.ptr != (Allocation *)0x0) {
    (*(inputBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    inputBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_358.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_350,local_358);
  }
  if (image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                        m_internal);
  }
  image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (image.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(image.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ImageAtomicOpTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Create an image

	const VkImageCreateInfo imageParams = make2DImageCreateInfo(m_imageSize, VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_STORAGE_BIT);
	const Image image(vk, device, allocator, imageParams, MemoryRequirement::Any);

	const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Unique<VkImageView> imageView(makeImageView(vk, device, *image, VK_IMAGE_VIEW_TYPE_2D, VK_FORMAT_R32_UINT, subresourceRange));

	// Input buffer

	const deUint32 numInputValues = multiplyComponents(m_imageSize) * m_localSize;
	const VkDeviceSize inputBufferSizeBytes = sizeof(deUint32) * numInputValues;

	const Buffer inputBuffer(vk, device, allocator, makeBufferCreateInfo(inputBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Populate the input buffer with test data
	{
		de::Random rnd(0x77238ac2);
		const Allocation& inputBufferAllocation = inputBuffer.getAllocation();
		deUint32* bufferPtr = static_cast<deUint32*>(inputBufferAllocation.getHostPtr());
		for (deUint32 i = 0; i < numInputValues; ++i)
			*bufferPtr++ = rnd.getUint32();

		flushMappedMemoryRange(vk, device, inputBufferAllocation.getMemory(), inputBufferAllocation.getOffset(), inputBufferSizeBytes);
	}

	// Create a buffer to store shader output (copied from image data)

	const deUint32 imageArea = multiplyComponents(m_imageSize);
	const VkDeviceSize outputBufferSizeBytes = sizeof(deUint32) * imageArea;
	const Buffer outputBuffer(vk, device, allocator, makeBufferCreateInfo(outputBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);

	// Create descriptor set

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));

	// Set the bindings

	const VkDescriptorImageInfo imageDescriptorInfo = makeDescriptorImageInfo(DE_NULL, *imageView, VK_IMAGE_LAYOUT_GENERAL);
	const VkDescriptorBufferInfo bufferDescriptorInfo = makeDescriptorBufferInfo(*inputBuffer, 0ull, inputBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &bufferDescriptorInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &imageDescriptorInfo)
		.update(vk, device);

	// Perform the computation
	{
		const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, m_context.getBinaryCollection().get("comp"), 0u));
		const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, *descriptorSetLayout));
		const Unique<VkPipeline> pipeline(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

		const VkBufferMemoryBarrier inputBufferPostHostWriteBarrier = makeBufferMemoryBarrier(VK_ACCESS_HOST_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT, *inputBuffer, 0ull, inputBufferSizeBytes);

		const VkImageMemoryBarrier imageLayoutBarrier = makeImageMemoryBarrier(
			(VkAccessFlags)0, VK_ACCESS_SHADER_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_GENERAL,
			*image, subresourceRange);

		const VkImageMemoryBarrier imagePreCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_GENERAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*image, subresourceRange);

		const VkBufferMemoryBarrier outputBufferPostCopyBarrier = makeBufferMemoryBarrier(VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *outputBuffer, 0ull, outputBufferSizeBytes);

		const VkBufferImageCopy copyParams = makeBufferImageCopy(m_imageSize);

		// Prepare the command buffer

		const Unique<VkCommandPool> cmdPool(makeCommandPool(vk, device, queueFamilyIndex));
		const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

		// Start recording commands

		beginCommandBuffer(vk, *cmdBuffer);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &inputBufferPostHostWriteBarrier, 1, &imageLayoutBarrier);
		vk.cmdDispatch(*cmdBuffer, m_imageSize.x(), m_imageSize.y(), 1u);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &imagePreCopyBarrier);
		vk.cmdCopyImageToBuffer(*cmdBuffer, *image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *outputBuffer, 1u, &copyParams);
		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &outputBufferPostCopyBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

		endCommandBuffer(vk, *cmdBuffer);

		// Wait for completion

		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Validate the results

	const Allocation& outputBufferAllocation = outputBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, outputBufferAllocation.getMemory(), outputBufferAllocation.getOffset(), outputBufferSizeBytes);

	const deUint32* bufferPtr = static_cast<deUint32*>(outputBufferAllocation.getHostPtr());
	const deUint32* refBufferPtr = static_cast<deUint32*>(inputBuffer.getAllocation().getHostPtr());

	for (deUint32 pixelNdx = 0; pixelNdx < imageArea; ++pixelNdx)
	{
		const deUint32	res = bufferPtr[pixelNdx];
		deUint32		ref = 0;

		for (deUint32 offs = 0; offs < m_localSize; ++offs)
			ref += refBufferPtr[pixelNdx * m_localSize + offs];

		if (res != ref)
		{
			std::ostringstream msg;
			msg << "Comparison failed for pixel " << pixelNdx;
			return tcu::TestStatus::fail(msg.str());
		}
	}
	return tcu::TestStatus::pass("Compute succeeded");
}